

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

void Bmc_ComputeSimTest(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wrd_t *pVVar5;
  Vec_Int_t *vPat2;
  Vec_Int_t *vPat;
  int DiffCount [64];
  int PatCount [64] [2] [2];
  int Count [2] [64] [64];
  int nPats;
  int Bit2;
  int Bit;
  int Res;
  int w;
  int v;
  int i;
  Gia_Man_t *p_local;
  
  memset(PatCount[0x3f] + 1,0,0x8000);
  memset(DiffCount + 0x3e,0,0x400);
  memset(&vPat,0,0x100);
  iVar1 = Gia_ManCiNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManCiNum(p);
  p_01 = Vec_IntAlloc(iVar1);
  Vec_WrdFreeP(&p->vSims);
  iVar1 = Gia_ManObjNum(p);
  pVVar5 = Vec_WrdStart(iVar1);
  p->vSims = pVVar5;
  printf("Number of patterns = %d.\n",0x100);
  for (w = 0; w < 0x100; w = w + 1) {
    Vec_IntClear(p_00);
    for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
      uVar2 = rand();
      Vec_IntPush(p_00,uVar2 & 1);
    }
    iVar1 = Bmc_ComputeSimDiff(p,p_00,p_01);
    for (Res = 0; iVar3 = Vec_IntSize(p_00), Res < iVar3; Res = Res + 1) {
      iVar3 = Vec_IntEntry(p_00,Res);
      PatCount[(long)Res + -1][(long)iVar1 + 1][iVar3] =
           PatCount[(long)Res + -1][(long)iVar1 + 1][iVar3] + 1;
    }
    for (Res = 0; iVar3 = Vec_IntSize(p_01), Res < iVar3; Res = Res + 1) {
      iVar3 = Vec_IntEntry(p_01,Res);
      Bit = Res;
      if (iVar3 != 0) {
        DiffCount[(long)Res + -2] = DiffCount[(long)Res + -2] + 1;
      }
      while( true ) {
        Bit = Bit + 1;
        iVar4 = Vec_IntSize(p_01);
        if (iVar4 <= Bit) break;
        iVar4 = Vec_IntEntry(p_01,Bit);
        if ((iVar3 != 0) && (iVar4 != 0)) {
          Count[(long)iVar1 + -1][(long)Res + 0x3f][(long)Bit + 0x3e] =
               Count[(long)iVar1 + -1][(long)Res + 0x3f][(long)Bit + 0x3e] + 1;
        }
      }
    }
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_WrdFreeP(&p->vSims);
  printf("\n");
  printf("      ");
  for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
    printf("%3c ",(ulong)(Res + 0x61));
  }
  printf("\n");
  printf("Off0  ");
  for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
    printf("%3d ",(ulong)(uint)PatCount[(long)Res + -1][1][0]);
  }
  printf("\n");
  printf("Off1  ");
  for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
    printf("%3d ",(ulong)(uint)PatCount[(long)Res + -1][1][1]);
  }
  printf("\n");
  printf("On0   ");
  for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
    printf("%3d ",(ulong)(uint)PatCount[Res][0][0]);
  }
  printf("\n");
  printf("On1   ");
  for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
    printf("%3d ",(ulong)(uint)PatCount[Res][0][1]);
  }
  printf("\n");
  printf("\n");
  printf("Diff  ");
  for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
    printf("%3d ",(ulong)(uint)DiffCount[(long)Res + -2]);
  }
  printf("\n");
  printf("\n");
  for (w = 0; w < 2; w = w + 1) {
    printf("      ");
    for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
      printf("%3c ",(ulong)(Res + 0x61));
    }
    printf("\n");
    for (Res = 0; iVar1 = Gia_ManCiNum(p), Res < iVar1; Res = Res + 1) {
      printf(" %c    ",(ulong)(Res + 0x61));
      for (Bit = 0; iVar1 = Gia_ManCiNum(p), Bit < iVar1; Bit = Bit + 1) {
        if (Count[(long)w + -1][(long)Res + 0x3f][(long)Bit + 0x3e] == 0) {
          printf("  . ");
        }
        else {
          printf("%3d ",(ulong)(uint)Count[(long)w + -1][(long)Res + 0x3f][(long)Bit + 0x3e]);
        }
      }
      printf("\n");
    }
    printf("\n");
  }
  return;
}

Assistant:

void Bmc_ComputeSimTest( Gia_Man_t * p )
{
    int i, v, w, Res, Bit, Bit2, nPats = 256;
    int Count[2][64][64] = {{{0}}};
    int PatCount[64][2][2] = {{{0}}};
    int DiffCount[64] = {0};
    Vec_Int_t * vPat = Vec_IntAlloc( Gia_ManCiNum(p) );
    Vec_Int_t * vPat2 = Vec_IntAlloc( Gia_ManCiNum(p) );
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) );
    printf( "Number of patterns = %d.\n", nPats );
    for ( i = 0; i < nPats; i++ )
    {
        Vec_IntClear( vPat );
        for ( v = 0; v < Gia_ManCiNum(p); v++ )
            Vec_IntPush( vPat, rand() & 1 );

//        Vec_IntForEachEntry( vPat, Bit, v )
//            printf( "%d", Bit );
//        printf( "    " );

        Res = Bmc_ComputeSimDiff( p, vPat, vPat2 );
//        printf( "%d ", Res );

//        Vec_IntForEachEntry( vPat2, Bit, v )
//            printf( "%d", Bit );
//        printf( "\n" );

        Vec_IntForEachEntry( vPat, Bit, v )
            PatCount[v][Res][Bit]++;

        Vec_IntForEachEntry( vPat2, Bit, v )
        {
            if ( Bit )
                DiffCount[v]++;
            Vec_IntForEachEntryStart( vPat2, Bit2, w, v + 1 )
                if ( Bit && Bit2 )
                    Count[Res][v][w]++;
        }
    }
    Vec_IntFree( vPat );
    Vec_IntFree( vPat2 );
    Vec_WrdFreeP( &p->vSims );


    printf( "\n" );
    printf( "      " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3c ", 'a'+v );
    printf( "\n" );

    printf( "Off0  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][0][0] );
    printf( "\n" );

    printf( "Off1  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][0][1] );
    printf( "\n" );

    printf( "On0   " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][1][0] );
    printf( "\n" );

    printf( "On1   " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][1][1] );
    printf( "\n" );
    printf( "\n" );

    printf( "Diff  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", DiffCount[v] );
    printf( "\n" );
    printf( "\n" );

    for ( i = 0; i < 2; i++ )
    {
        printf( "      " );
        for ( v = 0; v < Gia_ManCiNum(p); v++ )
            printf( "%3c ", 'a'+v );
        printf( "\n" );

        for ( v = 0; v < Gia_ManCiNum(p); v++ )
        {
            printf( " %c    ", 'a'+v );
            for ( w = 0; w < Gia_ManCiNum(p); w++ )
            {
                if ( Count[i][v][w] )
                    printf( "%3d ", Count[i][v][w] );
                else
                    printf( "  . " );
            }
            printf( "\n" );
        }
        printf( "\n" );
    }
}